

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTreeNode.cpp
# Opt level: O1

AVLTreeNode<long> * __thiscall itis::AVLTreeNode<long>::left_rotate(AVLTreeNode<long> *this)

{
  AVLTreeNode<long> *this_00;
  
  this_00 = this->right;
  this->right = this_00->left;
  this_00->left = this;
  updateValues(this);
  updateValues(this_00);
  return this_00;
}

Assistant:

AVLTreeNode<T>* AVLTreeNode<T>::left_rotate() {
    AVLTreeNode* R = right;
    right = right->left;
    R->left = this;

    this->updateValues();  // the order is important
    R->updateValues();

    return R;
  }